

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O1

int CivetServer::webSocketConnectionHandler(mg_connection *conn,void *cbdata)

{
  byte bVar1;
  uint uVar2;
  mg_request_info *pmVar3;
  
  pmVar3 = mg_get_request_info(conn);
  if (*(long *)((long)pmVar3->user_data + 8) == 0) {
    uVar2 = 0;
  }
  else if (cbdata == (void *)0x0) {
    uVar2 = 1;
  }
  else {
    bVar1 = (**(code **)(*cbdata + 0x10))(cbdata,pmVar3->user_data,conn);
    uVar2 = (uint)(bVar1 ^ 1);
  }
  return uVar2;
}

Assistant:

int
CivetServer::webSocketConnectionHandler(const struct mg_connection *conn,
                                        void *cbdata)
{
	const struct mg_request_info *request_info = mg_get_request_info(conn);
	assert(request_info != NULL);
	CivetServer *me = (CivetServer *)(request_info->user_data);
	assert(me != NULL);

	// Happens when a request hits the server before the context is saved
	if (me->context == NULL)
		return 0;

	CivetWebSocketHandler *handler = (CivetWebSocketHandler *)cbdata;

	if (handler) {
		return handler->handleConnection(me, conn) ? 0 : 1;
	}

	return 1; // No handler found, close connection
}